

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O1

void dragon_death_check(int hp)

{
  ostream *poVar1;
  string local_58;
  string local_38;
  
  if (0 < hp) {
    return;
  }
  local_58._M_dataplus._M_p = (pointer)0x2bc;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_58);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,anon_var_dwarf_4e85a,anon_var_dwarf_4e85a + 0x16);
  red_text(&local_58,&local_38);
  std::operator<<(poVar1,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  local_58._M_dataplus._M_p = (pointer)0x12c;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_58);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pause();
  exit(0);
}

Assistant:

void dragon_death_check(int hp){
	if(hp<=0)
    {
        this_thread::sleep_for(chrono::milliseconds(700));
        cout<<endl<<red_text("勇者擊敗了惡龍!");
        this_thread::sleep_for(chrono::milliseconds(300));
        cout<<endl;
        pause();
        exit(0);
    }
}